

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpa.c
# Opt level: O1

uint64_t hpa_time_until_deferred_work(tsdn_t *tsdn,pai_t *self)

{
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr **__mutex;
  _func_uint64_t_tsdn_t_ptr_pai_t_ptr *p_Var1;
  _Bool _Var2;
  int iVar3;
  hpdata_t *phVar4;
  _func_uint64_t_tsdn_t_ptr_pai_t_ptr *p_Var5;
  _func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *p_Var6;
  ulong uVar7;
  long lVar8;
  hpa_shard_t *shard;
  ulong uVar9;
  nstime_t time_hugify_allowed;
  
  __mutex = &self[2].shrink;
  shard = (hpa_shard_t *)self;
  iVar3 = pthread_mutex_trylock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)&self[1].alloc_batch);
    *(undefined1 *)&self[2].expand = 1;
  }
  self[2].alloc_batch = self[2].alloc_batch + 1;
  if ((tsdn_t *)self[2].alloc != tsdn) {
    self[2].alloc =
         (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)tsdn;
    self[1].time_until_deferred_work = self[1].time_until_deferred_work + 1;
  }
  phVar4 = duckdb_je_psset_pick_hugify((psset_t *)&self[5].dalloc_batch);
  if (phVar4 == (hpdata_t *)0x0) {
    uVar9 = 0xffffffffffffffff;
  }
  else {
    p_Var5 = (_func_uint64_t_tsdn_t_ptr_pai_t_ptr *)(**(code **)(self[1].alloc + 0xc0))();
    p_Var1 = self[100].time_until_deferred_work;
    if (p_Var1 < p_Var5 || (long)p_Var1 - (long)p_Var5 == 0) {
      *(undefined1 *)&self[2].expand = 0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      uVar9 = 0xffffffffffffffff;
    }
    else {
      uVar9 = ((long)p_Var1 - (long)p_Var5) * 1000000;
    }
    if (p_Var1 <= p_Var5) {
      return 0;
    }
  }
  _Var2 = hpa_should_purge((tsdn_t *)self,shard);
  if (_Var2) {
    if (self[0x65].shrink !=
        (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)0x0) {
      p_Var6 = (_func_edata_t_ptr_tsdn_t_ptr_pai_t_ptr_size_t_size_t__Bool__Bool__Bool__Bool_ptr *)
               (**(code **)(self[1].alloc + 0xc0))(self + 0x66);
      lVar8 = (long)self[0x65].alloc - (long)p_Var6;
      if (p_Var6 <= self[0x65].alloc && lVar8 != 0) {
        uVar7 = lVar8 * 1000000;
        if (uVar7 < uVar9) {
          uVar9 = uVar7;
        }
        goto LAB_01db1248;
      }
    }
    uVar9 = 0;
  }
LAB_01db1248:
  *(undefined1 *)&self[2].expand = 0;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return uVar9;
}

Assistant:

static uint64_t
hpa_time_until_deferred_work(tsdn_t *tsdn, pai_t *self) {
	hpa_shard_t *shard = hpa_from_pai(self);
	uint64_t time_ns = BACKGROUND_THREAD_DEFERRED_MAX;

	malloc_mutex_lock(tsdn, &shard->mtx);

	hpdata_t *to_hugify = psset_pick_hugify(&shard->psset);
	if (to_hugify != NULL) {
		nstime_t time_hugify_allowed =
		    hpdata_time_hugify_allowed(to_hugify);
		uint64_t since_hugify_allowed_ms =
		    shard->central->hooks.ms_since(&time_hugify_allowed);
		/*
		 * If not enough time has passed since hugification was allowed,
		 * sleep for the rest.
		 */
		if (since_hugify_allowed_ms < shard->opts.hugify_delay_ms) {
			time_ns = shard->opts.hugify_delay_ms -
			    since_hugify_allowed_ms;
			time_ns *= 1000 * 1000;
		} else {
			malloc_mutex_unlock(tsdn, &shard->mtx);
			return BACKGROUND_THREAD_DEFERRED_MIN;
		}
	}

	if (hpa_should_purge(tsdn, shard)) {
		/*
		 * If we haven't purged before, no need to check interval
		 * between purges. Simply purge as soon as possible.
		 */
		if (shard->stats.npurge_passes == 0) {
			malloc_mutex_unlock(tsdn, &shard->mtx);
			return BACKGROUND_THREAD_DEFERRED_MIN;
		}
		uint64_t since_last_purge_ms = shard->central->hooks.ms_since(
		    &shard->last_purge);

		if (since_last_purge_ms < shard->opts.min_purge_interval_ms) {
			uint64_t until_purge_ns;
			until_purge_ns = shard->opts.min_purge_interval_ms -
			    since_last_purge_ms;
			until_purge_ns *= 1000 * 1000;

			if (until_purge_ns < time_ns) {
				time_ns = until_purge_ns;
			}
		} else {
			time_ns = BACKGROUND_THREAD_DEFERRED_MIN;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	return time_ns;
}